

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vdbePmaReaderClear(PmaReader *pReadr)

{
  PmaReader *pReadr_local;
  
  sqlite3_free(pReadr->aAlloc);
  sqlite3_free(pReadr->aBuffer);
  if (pReadr->aMap != (u8 *)0x0) {
    sqlite3OsUnfetch(pReadr->pFd,0,pReadr->aMap);
  }
  vdbeIncrFree(pReadr->pIncr);
  memset(pReadr,0,0x50);
  return;
}

Assistant:

static void vdbePmaReaderClear(PmaReader *pReadr){
  sqlite3_free(pReadr->aAlloc);
  sqlite3_free(pReadr->aBuffer);
  if( pReadr->aMap ) sqlite3OsUnfetch(pReadr->pFd, 0, pReadr->aMap);
  vdbeIncrFree(pReadr->pIncr);
  memset(pReadr, 0, sizeof(PmaReader));
}